

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_trie.c
# Opt level: O0

int main(void)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  trie_test();
  printf("Test successful\n");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int main(void)
{
	trie_test();
	printf("Test successful\n");
	return EXIT_SUCCESS;
}